

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

_Bool Curl_pipeline_checkget_write(SessionHandle *data,connectdata *conn)

{
  curl_llist_element *pcVar1;
  _Bool _Var2;
  curl_llist_element *curr;
  
  _Var2 = true;
  if ((conn->bits).multiplex == false) {
    if (((conn->writechannel_inuse == false) &&
        (pcVar1 = conn->send_pipe->head, pcVar1 != (curl_llist_element *)0x0)) &&
       ((SessionHandle *)pcVar1->ptr == data)) {
      conn->writechannel_inuse = true;
      return _Var2;
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool Curl_pipeline_checkget_write(struct SessionHandle *data,
                                  struct connectdata *conn)
{
  if(conn->bits.multiplex)
    /* when multiplexing, we can use it at once */
    return TRUE;

  if(!conn->writechannel_inuse && Curl_sendpipe_head(data, conn)) {
    /* Grab the channel */
    conn->writechannel_inuse = TRUE;
    return TRUE;
  }
  return FALSE;
}